

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O2

void __thiscall
slang::ast::Compilation::resolveBindTargets
          (Compilation *this,BindDirectiveSyntax *syntax,Scope *scope,ResolvedBind *resolvedBind)

{
  SeparatedSyntaxList<slang::syntax::NameSyntax> *pSVar1;
  NameSyntax *pNVar2;
  size_t sVar3;
  MemberSyntax *pMVar4;
  Symbol *pSVar5;
  bool bVar6;
  SyntaxNode *pSVar7;
  DefinitionSymbol *pDVar8;
  Diagnostic *this_00;
  Diagnostic *this_01;
  InstanceBodySymbol *pIVar9;
  string_view sVar10;
  SourceRange SVar11;
  iterator __begin3;
  anon_class_8_1_a89d2d74 checkValidTarget;
  ASTContext local_2d0;
  Token name;
  LookupResult result;
  
  local_2d0.lookupIndex = 0xffffffff;
  local_2d0.assertionInstance = (AssertionInstanceDetails *)0x0;
  local_2d0.flags.m_bits = 0;
  local_2d0.instanceOrProc = (Symbol *)0x0;
  local_2d0.firstTempVar = (TempVarSymbol *)0x0;
  local_2d0.randomizeDetails = (RandomizeDetails *)0x0;
  checkValidTarget.scope = scope;
  local_2d0.scope.ptr = scope;
  if (syntax->targetInstances == (BindTargetListSyntax *)0x0) {
    result.selectors.
    super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
    .data_ = (pointer)result.selectors.
                      super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                      .firstElement;
    result.found = (Symbol *)0x0;
    result.systemSubroutine._0_5_ = 0;
    result.systemSubroutine._5_3_ = 0;
    result.upwardCount = 0;
    result.flags.m_bits = '\0';
    result.selectors.
    super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
    .len = 0;
    result.selectors.
    super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
    .cap = 4;
    result.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.data_ =
         (pointer)result.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.
                  firstElement;
    result.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.len = 0;
    result.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.cap = 2;
    result.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
    super_SmallVectorBase<slang::Diagnostic>.data_ =
         (pointer)result.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
                  super_SmallVectorBase<slang::Diagnostic>.firstElement;
    result.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
    super_SmallVectorBase<slang::Diagnostic>.len = 0;
    result.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
    super_SmallVectorBase<slang::Diagnostic>.cap = 2;
    Lookup::name((syntax->target).ptr,&local_2d0,(bitmask<slang::ast::LookupFlags>)0x96,&result);
    pSVar7 = (SyntaxNode *)(syntax->target).ptr;
    if (result.found == (Symbol *)0x0) {
      if (pSVar7->kind == IdentifierName) {
        __begin3.list = *(ParentList **)(pSVar7 + 1);
        __begin3.index = (size_t)pSVar7[1].parent;
        sVar10 = parsing::Token::valueText((Token *)&__begin3);
        SVar11 = parsing::Token::range((Token *)&__begin3);
        getDefinition((DefinitionLookupResult *)&name,this,sVar10,scope,SVar11,(DiagCode)0xcf0006);
        if (name._0_8_ == 0) {
          LookupResult::~LookupResult(&result);
          return;
        }
        if (*(int *)name._0_8_ == 2) {
          resolvedBind->defTarget = (DefinitionSymbol *)name._0_8_;
        }
      }
    }
    else {
      bVar6 = resolveBindTargets::anon_class_8_1_a89d2d74::operator()
                        (&checkValidTarget,result.found,pSVar7);
      if (bVar6) {
        SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*const&>
                  ((SmallVectorBase<slang::ast::Symbol_const*> *)resolvedBind,&result.found);
      }
    }
    if (resolvedBind->defTarget == (DefinitionSymbol *)0x0) {
      LookupResult::reportDiags(&result,&local_2d0);
    }
    LookupResult::~LookupResult(&result);
  }
  else {
    pNVar2 = (syntax->target).ptr;
    if ((pNVar2->super_ExpressionSyntax).super_SyntaxNode.kind != IdentifierName) {
      return;
    }
    name._0_8_ = *(undefined8 *)&pNVar2[1].super_ExpressionSyntax.super_SyntaxNode;
    name.info = (Info *)pNVar2[1].super_ExpressionSyntax.super_SyntaxNode.parent;
    sVar10 = parsing::Token::valueText(&name);
    SVar11 = parsing::Token::range(&name);
    getDefinition((DefinitionLookupResult *)&result,this,sVar10,scope,SVar11,(DiagCode)0xcf0006);
    pSVar5 = result.found;
    if (result.found == (Symbol *)0x0) {
      return;
    }
    pSVar1 = &syntax->targetInstances->targets;
    __begin3.index = 0;
    sVar3 = (syntax->targetInstances->targets).elements._M_extent._M_extent_value;
    __begin3.list = pSVar1;
    for (; (__begin3.list != pSVar1 || (__begin3.index != sVar3 + 1 >> 1));
        __begin3.index = __begin3.index + 1) {
      pSVar7 = (SyntaxNode *)
               slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::
               iterator_base<slang::syntax::NameSyntax_*>::dereference(&__begin3);
      result.found = (Symbol *)0x0;
      result.systemSubroutine._0_5_ = 0;
      result.systemSubroutine._5_3_ = 0;
      result.upwardCount = 0;
      result.flags.m_bits = '\0';
      result.selectors.
      super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
      .data_ = (pointer)result.selectors.
                        super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                        .firstElement;
      result.selectors.
      super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
      .len = 0;
      result.selectors.
      super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
      .cap = 4;
      result.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.data_ =
           (pointer)result.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.
                    firstElement;
      result.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.len = 0;
      result.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.cap = 2;
      result.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
      super_SmallVectorBase<slang::Diagnostic>.data_ =
           (pointer)result.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
                    super_SmallVectorBase<slang::Diagnostic>.firstElement;
      result.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
      super_SmallVectorBase<slang::Diagnostic>.len = 0;
      result.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
      super_SmallVectorBase<slang::Diagnostic>.cap = 2;
      Lookup::name((NameSyntax *)pSVar7,&local_2d0,(bitmask<slang::ast::LookupFlags>)0x96,&result);
      LookupResult::reportDiags(&result,&local_2d0);
      if ((result.found != (Symbol *)0x0) &&
         (bVar6 = resolveBindTargets::anon_class_8_1_a89d2d74::operator()
                            (&checkValidTarget,result.found,pSVar7), bVar6)) {
        pDVar8 = InstanceSymbol::getDefinition((InstanceSymbol *)result.found);
        if (pDVar8 != (DefinitionSymbol *)pSVar5) {
          SVar11 = slang::syntax::SyntaxNode::sourceRange(pSVar7);
          this_00 = Scope::addDiag(scope,(DiagCode)0x23000d,SVar11);
          this_01 = Diagnostic::operator<<(this_00,(result.found)->name);
          Diagnostic::operator<<(this_01,pSVar5->name);
          SVar11 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)(syntax->target).ptr);
          Diagnostic::operator<<(this_00,SVar11);
          Diagnostic::addNote(this_00,(DiagCode)0x50001,(result.found)->location);
        }
        SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*const&>
                  ((SmallVectorBase<slang::ast::Symbol_const*> *)resolvedBind,&result.found);
      }
      LookupResult::~LookupResult(&result);
    }
  }
  pMVar4 = (syntax->instantiation).ptr;
  if ((pMVar4->super_SyntaxNode).kind == HierarchyInstantiation) {
    sVar10 = parsing::Token::valueText((Token *)(pMVar4 + 1));
    tryGetDefinition((DefinitionLookupResult *)&result,this,sVar10,scope);
    (resolvedBind->instanceDef).configRule = (ConfigRule *)CONCAT35(result._21_3_,result._16_5_);
    (resolvedBind->instanceDef).definition = result.found;
    (resolvedBind->instanceDef).configRoot =
         (ConfigBlockSymbol *)CONCAT35(result.systemSubroutine._5_3_,result.systemSubroutine._0_5_);
    if ((((resolvedBind->instanceDef).configRoot == (ConfigBlockSymbol *)0x0) &&
        (pIVar9 = Scope::getContainingInstance(scope), pIVar9 != (InstanceBodySymbol *)0x0)) &&
       (pIVar9->parentInstance != (InstanceSymbol *)0x0)) {
      resolvedBind->resolvedConfig = pIVar9->parentInstance->resolvedConfig;
    }
  }
  return;
}

Assistant:

void Compilation::resolveBindTargets(const BindDirectiveSyntax& syntax, const Scope& scope,
                                     ResolvedBind& resolvedBind) {
    auto checkValidTarget = [&](const Symbol& symbol, const SyntaxNode& nameSyntax) {
        if (symbol.kind == SymbolKind::Instance) {
            auto defKind = symbol.as<InstanceSymbol>().getDefinition().definitionKind;
            if (defKind == DefinitionKind::Module || defKind == DefinitionKind::Interface)
                return true;
        }

        auto& diag = scope.addDiag(diag::InvalidBindTarget, nameSyntax.sourceRange());
        diag << symbol.name;
        diag.addNote(diag::NoteDeclarationHere, symbol.location);
        return false;
    };

    // If an instance list is given, then the target name must be a definition name.
    // Otherwise, the target name can be either an instance name or a definition name,
    // preferencing the instance if found.
    ASTContext context(scope, LookupLocation::max);
    bitmask<LookupFlags> flags = LookupFlags::ForceHierarchical |
                                 LookupFlags::DisallowWildcardImport | LookupFlags::NoSelectors;

    if (syntax.targetInstances) {
        if (syntax.target->kind != SyntaxKind::IdentifierName)
            return;

        Token name = syntax.target->as<IdentifierNameSyntax>().identifier;
        auto targetDef =
            getDefinition(name.valueText(), scope, name.range(), diag::UnknownModule).definition;
        if (!targetDef)
            return;

        for (auto inst : syntax.targetInstances->targets) {
            LookupResult result;
            Lookup::name(*inst, context, flags, result);
            result.reportDiags(context);

            if (result.found) {
                if (checkValidTarget(*result.found, *inst)) {
                    if (&result.found->as<InstanceSymbol>().getDefinition() != targetDef) {
                        auto& diag = scope.addDiag(diag::WrongBindTargetDef, inst->sourceRange());
                        diag << result.found->name << targetDef->name;
                        diag << syntax.target->sourceRange();
                        diag.addNote(diag::NoteDeclarationHere, result.found->location);
                    }
                    resolvedBind.instTargets.push_back(result.found);
                }
            }
        }
    }
    else {
        LookupResult result;
        Lookup::name(*syntax.target, context, flags, result);

        if (result.found) {
            if (checkValidTarget(*result.found, *syntax.target))
                resolvedBind.instTargets.push_back(result.found);
        }
        else {
            // If we didn't find the name as an instance, try as a definition.
            if (syntax.target->kind == SyntaxKind::IdentifierName) {
                Token name = syntax.target->as<IdentifierNameSyntax>().identifier;
                auto def = getDefinition(name.valueText(), scope, name.range(), diag::UnknownModule)
                               .definition;
                if (!def)
                    return;

                if (def->kind == SymbolKind::Definition)
                    resolvedBind.defTarget = &def->as<DefinitionSymbol>();
            }
        }

        if (!resolvedBind.defTarget)
            result.reportDiags(context);
    }

    // Resolve the actual instantiation definition now, since it depends on the current
    // config mapping, not the mapping of the target scope(s).
    if (syntax.instantiation->kind == SyntaxKind::HierarchyInstantiation) {
        auto& his = syntax.instantiation->as<HierarchyInstantiationSyntax>();
        resolvedBind.instanceDef = tryGetDefinition(his.type.valueText(), scope);

        // If we did not directly resolve to a new config root, look for a config
        // in our parent scope. If there is one, pretend we've created a new
        // config root at the targeted bind instance, so that modules underneath
        // the bound instance get the correct config.
        if (!resolvedBind.instanceDef.configRoot) {
            if (auto inst = scope.getContainingInstance(); inst && inst->parentInstance)
                resolvedBind.resolvedConfig = inst->parentInstance->resolvedConfig;
        }
    }
}